

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvector.h
# Opt level: O2

int __thiscall gmath::DVector<double>::init(DVector<double> *this,EVP_PKEY_CTX *ctx)

{
  double *in_RAX;
  double *extraout_RAX;
  int i;
  ulong uVar1;
  
  if (this->v != (double *)0x0) {
    operator_delete__(this->v);
    in_RAX = extraout_RAX;
  }
  this->n = (int)ctx;
  this->v = (double *)0x0;
  if (0 < (int)ctx) {
    in_RAX = (double *)operator_new__(((ulong)ctx & 0xffffffff) * 8);
    this->v = in_RAX;
    for (uVar1 = 0; ((ulong)ctx & 0xffffffff) != uVar1; uVar1 = uVar1 + 1) {
      in_RAX[uVar1] = 0.0;
    }
  }
  return (int)in_RAX;
}

Assistant:

void init(int len)
    {
      if (v != 0)
      {
        delete [] v;
      }

      n=len;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=0;
        }
      }
    }